

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O0

void __thiscall n_e_s::core::Ppu::write_byte(Ppu *this,uint16_t addr,uint8_t byte)

{
  byte bVar1;
  IMmu *pIVar2;
  bool bVar3;
  unsigned_short uVar4;
  PpuVram local_24;
  ushort local_22;
  ushort local_20;
  PpuVram local_1e;
  undefined2 local_1c;
  uint16_t lower_byte;
  uint16_t upper_byte;
  PpuMask local_15;
  uint16_t x_scroll;
  uint16_t fine_y_scroll;
  uint16_t y_scroll;
  PpuCtrl new_ctrl;
  uint8_t byte_local;
  uint16_t addr_local;
  Ppu *this_local;
  
  x_scroll._1_1_ = byte;
  fine_y_scroll = addr;
  _y_scroll = this;
  if (addr == 0x2000) {
    Register<unsigned_char>::Register((Register<unsigned_char> *)&x_scroll,byte);
    bVar3 = Register<unsigned_char>::is_set(&this->registers_->ctrl,7);
    if (((!bVar3) &&
        (bVar3 = Register<unsigned_char>::is_set((Register<unsigned_char> *)&x_scroll,7), bVar3)) &&
       (bVar3 = Register<unsigned_char>::is_set(&this->registers_->status,7), bVar3)) {
      std::function<void_()>::operator()(&this->on_nmi_);
    }
    (this->registers_->ctrl).value_ = (uchar)x_scroll;
    PpuVram::set_nametable(&this->registers_->temp_vram_addr,x_scroll._1_1_);
  }
  else if (addr == 0x2001) {
    PpuMask::Register(&local_15,byte);
    (this->registers_->mask).super_Register<unsigned_char>.value_ =
         (uchar)local_15.super_Register<unsigned_char>.value_;
  }
  else if (addr == 0x2003) {
    this->registers_->oamaddr = byte;
  }
  else if (addr == 0x2004) {
    bVar3 = is_rendering_active(this);
    if (!bVar3) {
      bVar1 = this->registers_->oamaddr;
      this->registers_->oamaddr = bVar1 + 1;
      this->oam_data_[bVar1] = x_scroll._1_1_;
    }
  }
  else if (addr == 0x2005) {
    if ((this->registers_->write_toggle & 1U) == 0) {
      local_1c = (undefined2)((int)(uint)byte >> 3);
      PpuVram::set_coarse_scroll_x
                (&this->registers_->temp_vram_addr,(uint8_t)((int)(uint)byte >> 3));
      this->registers_->fine_x_scroll = x_scroll._1_1_ & 7;
      this->registers_->write_toggle = true;
    }
    else {
      upper_byte = (uint16_t)((int)(uint)byte >> 3);
      lower_byte = byte & 7;
      PpuVram::set_fine_scroll_y(&this->registers_->temp_vram_addr,(uint8_t)lower_byte);
      PpuVram::set_coarse_scroll_y(&this->registers_->temp_vram_addr,(uint8_t)upper_byte);
      this->registers_->write_toggle = false;
    }
  }
  else if (addr == 0x2006) {
    if ((this->registers_->write_toggle & 1U) == 0) {
      local_20 = (byte & 0x3f) << 8;
      uVar4 = Register<unsigned_short>::value
                        (&(this->registers_->temp_vram_addr).super_Register<unsigned_short>);
      local_22 = uVar4 & 0xff;
      PpuVram::Register(&local_24,local_20 | local_22);
      (this->registers_->temp_vram_addr).super_Register<unsigned_short>.value_ =
           (unsigned_short)local_24.super_Register<unsigned_short>.value_;
      this->registers_->write_toggle = true;
    }
    else {
      uVar4 = Register<unsigned_short>::value
                        (&(this->registers_->temp_vram_addr).super_Register<unsigned_short>);
      PpuVram::Register(&local_1e,uVar4 & 0xff00 | (ushort)x_scroll._1_1_);
      (this->registers_->temp_vram_addr).super_Register<unsigned_short>.value_ =
           (unsigned_short)local_1e.super_Register<unsigned_short>.value_;
      (this->registers_->vram_addr).super_Register<unsigned_short>.value_ =
           (this->registers_->temp_vram_addr).super_Register<unsigned_short>.value_;
      this->registers_->write_toggle = false;
    }
  }
  else if (addr == 0x2007) {
    pIVar2 = this->mmu_;
    uVar4 = Register<unsigned_short>::value
                      (&(this->registers_->vram_addr).super_Register<unsigned_short>);
    (*pIVar2->_vptr_IMmu[4])(pIVar2,(ulong)uVar4,(ulong)x_scroll._1_1_);
    increment_vram_address(this);
  }
  else {
    (*this->mmu_->_vptr_IMmu[4])(this->mmu_,(ulong)addr,(ulong)byte);
  }
  return;
}

Assistant:

void Ppu::write_byte(uint16_t addr, uint8_t byte) {
    if (addr == kPpuCtrl) {
        const auto new_ctrl = PpuCtrl(byte);
        // Trigger nmi if the nmi-enabled flag goes from 0 to 1 during vblank.
        if (!registers_->ctrl.is_set(7u) && new_ctrl.is_set(7u) &&
                registers_->status.is_set(7u)) {
            on_nmi_();
        }

        registers_->ctrl = new_ctrl;
        registers_->temp_vram_addr.set_nametable(byte);
    } else if (addr == kPpuMask) {
        registers_->mask = PpuMask(byte);
    } else if (addr == kOamAddr) {
        registers_->oamaddr = byte;
    } else if (addr == kOamData) {
        if (!is_rendering_active()) {
            oam_data_[registers_->oamaddr++] = byte;
        }
    } else if (addr == kPpuScroll) {
        if (registers_->write_toggle) { // Second write, Y scroll
            const uint16_t y_scroll = (byte >> 3u);
            const auto fine_y_scroll = static_cast<uint16_t>(byte & 7u);
            registers_->temp_vram_addr.set_fine_scroll_y(fine_y_scroll);
            registers_->temp_vram_addr.set_coarse_scroll_y(y_scroll);
            registers_->write_toggle = false;
        } else { // First write, X Scroll
            const uint16_t x_scroll = (byte >> 3u);
            registers_->temp_vram_addr.set_coarse_scroll_x(x_scroll);
            registers_->fine_x_scroll = static_cast<uint8_t>(byte & 7u);
            registers_->write_toggle = true;
        }
    } else if (addr == kPpuAddr) {
        if (registers_->write_toggle) { // Second write, lower address byte
            registers_->temp_vram_addr = PpuVram(
                    (registers_->temp_vram_addr.value() & 0xFF00u) | byte);
            registers_->vram_addr = registers_->temp_vram_addr;
            registers_->write_toggle = false;
        } else { // First write, upper address byte
            // Valid addresses are $0000-$3FFF; higher addresses will be
            // mirrored down.
            const uint16_t upper_byte = (byte & 0x3Fu) << 8u;
            const uint16_t lower_byte =
                    registers_->temp_vram_addr.value() & 0x00FFu;
            registers_->temp_vram_addr = PpuVram(upper_byte | lower_byte);
            registers_->write_toggle = true;
        }
    } else if (addr == kPpuData) {
        mmu_->write_byte(registers_->vram_addr.value(), byte);
        increment_vram_address();
    } else {
        mmu_->write_byte(addr, byte);
    }
}